

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O0

void __thiscall Indexing::ClauseCodeTree::LiteralMatcher::recordMatch(LiteralMatcher *this)

{
  ILStruct *this_00;
  long in_RDI;
  ILStruct *ils;
  DArray<Kernel::TermList> *in_stack_00000020;
  uint in_stack_0000002c;
  ILStruct *in_stack_00000030;
  
  this_00 = CodeTree::CodeOp::getILS((CodeOp *)0x2f653a);
  CodeTree::ILStruct::ensureFreshness(this_00,*(uint *)(*(long *)(in_RDI + 0x60) + 0xc));
  if ((this_00->finished & 1U) == 0) {
    if ((this_00->matchCnt == 0) &&
       ((*(byte *)(*(long *)(in_RDI + 0x68) + *(long *)(in_RDI + 0x78) * 0x18 + 0x10) & 1) != 0)) {
      this_00->noNonOppositeMatches = true;
    }
    CodeTree::ILStruct::addMatch(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  }
  return;
}

Assistant:

void ClauseCodeTree::LiteralMatcher::recordMatch()
{
  ASS(matched());

  ILStruct* ils=op->getILS();
  ils->ensureFreshness(tree->_curTimeStamp);
  if(ils->finished) {
    //no need to record matches which we already know will not lead to anything
    return;
  }
  if(!ils->matchCnt && linfos[curLInfo].opposite) {
    //if we're matching opposite matches, we have already tried all non-opposite ones
    ils->noNonOppositeMatches=true;
  }
  ils->addMatch(linfos[curLInfo].liIndex, bindings);
}